

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

void genBiomeNoise3D(BiomeNoise *bn,int *out,Range r,int opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint64_t *puVar4;
  uint uVar5;
  int iVar6;
  uint64_t *dat;
  uint64_t local_38;
  
  puVar4 = (uint64_t *)0x0;
  local_38 = 0;
  dat = &local_38;
  if (opt == 0) {
    dat = puVar4;
  }
  uVar5 = 1;
  if (4 < r.scale) {
    uVar5 = (uint)r.scale >> 2;
  }
  if (0 < r.sy) {
    do {
      if (0 < r.sz) {
        iVar2 = 0;
        do {
          if (0 < r.sx) {
            iVar6 = 0;
            do {
              iVar1 = sampleBiomeNoise(bn,(int64_t *)0x0,(r.x + iVar6) * uVar5 + (uVar5 >> 1),
                                       r.y + (int)puVar4,(r.z + iVar2) * uVar5 + (uVar5 >> 1),dat,
                                       (uint)(opt != 0));
              *out = iVar1;
              out = out + 1;
              iVar6 = iVar6 + 1;
            } while (iVar6 < r.sx);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < r.sz);
      }
      uVar3 = (int)puVar4 + 1;
      puVar4 = (uint64_t *)(ulong)uVar3;
    } while ((int)uVar3 < r.sy);
  }
  return;
}

Assistant:

static void genBiomeNoise3D(const BiomeNoise *bn, int *out, Range r, int opt)
{
    uint64_t dat = 0;
    uint64_t *p_dat = opt ? &dat : NULL;
    uint32_t flags = opt ? SAMPLE_NO_SHIFT : 0;
    int i, j, k;
    int *p = out;
    int scale = r.scale > 4 ? r.scale / 4 : 1;
    int mid = scale / 2;
    for (k = 0; k < r.sy; k++)
    {
        int yk = (r.y+k);
        for (j = 0; j < r.sz; j++)
        {
            int zj = (r.z+j)*scale + mid;
            for (i = 0; i < r.sx; i++)
            {
                int xi = (r.x+i)*scale + mid;
                *p = sampleBiomeNoise(bn, NULL, xi, yk, zj, p_dat, flags);
                p++;
            }
        }
    }
}